

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmpolicytctobin.cpp
# Opt level: O2

void fmpolicytctobin::doit(void)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  fm_policyTC q;
  char line [4096];
  
  fgets(line,0x1000,_stdin);
  uVar3 = 1;
  while( true ) {
    pcVar2 = fgets(line,0x1000,_stdin);
    if (pcVar2 == (char *)0x0) {
      return;
    }
    iVar1 = __isoc99_sscanf(line,"%d,%d,%d,%d",&q.layer_id,&q,&q.agg_id,&q.profile_id);
    if (iVar1 != 4) break;
    fwrite(&q,0x10,1,_stdout);
    uVar3 = uVar3 + 1;
  }
  fprintf(_stderr,"Invalid data in line %d:\n%s",(ulong)uVar3,line);
  return;
}

Assistant:

void doit()
	{

		fm_policyTC q;
		char line[4096];
		int lineno = 0;
		fgets(line, sizeof(line), stdin);
		lineno++;
		while (fgets(line, sizeof(line), stdin) != 0)
		{
			if (sscanf(line, "%d,%d,%d,%d", &q.layer_id, &q.level_id, &q.agg_id, &q.profile_id) != 4) {
				fprintf(stderr, "Invalid data in line %d:\n%s", lineno, line);
				return;
			}
			else
			{
				fwrite(&q, sizeof(q), 1, stdout);
			}
			lineno++;
		}

	}